

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O3

void __thiscall
DemoScripts::TrainSpikingIris(DemoScripts *this,char *path,default_random_engine *generator)

{
  pointer ppIVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  IDenseNetwork *pIVar6;
  ulong uVar7;
  ostream *poVar8;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  initializer_list<LayerMeta> __l;
  vector<float,_std::allocator<float>_> output;
  vector<float,_std::allocator<float>_> deltas;
  SpikeTrainDataset data;
  vector<LayerMeta,_std::allocator<LayerMeta>_> layersMeta;
  Dataset rawData;
  LifSynapseBuilder synapseBuilder;
  PreciseEventManager eventManager;
  float local_28c;
  float local_288;
  int local_284;
  string local_280;
  double local_260;
  undefined1 local_258 [8];
  undefined8 uStack_250;
  ulong local_240;
  float local_234;
  int local_230;
  int local_22c;
  vector<float,_std::allocator<float>_> local_228;
  IDenseNetwork *local_210;
  SpikeTrainDataset local_208;
  ulong local_1a0;
  vector<INeuron_*,_std::allocator<INeuron_*>_> local_198;
  undefined **local_180;
  undefined1 local_178 [32];
  undefined1 local_158 [8];
  _Alloc_hider _Stack_150;
  pointer local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_140;
  pointer pfStack_130;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_128;
  pointer *ppfStack_110;
  pointer local_108;
  pointer apfStack_100 [2];
  undefined8 local_f0;
  pointer local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  undefined8 local_b0;
  pointer local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  LifSynapseBuilder local_78 [16];
  code *local_68;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>_>_>
  local_60 [48];
  
  LifSynapseBuilder::LifSynapseBuilder(local_78,(linear_congruential_engine *)generator);
  local_178._0_8_ = __gmon_start__;
  local_180 = &PTR_Build_00116cf8;
  PreciseEventManager::PreciseEventManager((PreciseEventManager *)&local_68);
  local_158._0_4_ = 1.0;
  _Stack_150._M_p = (pointer)&aStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_150,"input","");
  pfStack_130 = (pointer)0x4;
  local_128.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f800000;
  local_128.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_128.
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x3f800000);
  ppfStack_110 = apfStack_100;
  local_128.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ppfStack_110,"hidden2","");
  local_f0 = 6;
  local_e0 = 0x3f80000040000000;
  local_d8 = 0x3f000000;
  plVar10 = local_c0;
  local_e8 = (pointer)local_178;
  local_d0[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"output","");
  local_b0 = 3;
  local_a0 = 0x3f8000003f000000;
  __l._M_len = 3;
  __l._M_array = (iterator)local_158;
  local_a8 = (pointer)local_178;
  std::vector<LayerMeta,_std::allocator<LayerMeta>_>::vector
            ((vector<LayerMeta,_std::allocator<LayerMeta>_> *)(local_178 + 8),__l,
             (allocator_type *)&local_208);
  lVar15 = -0xc0;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -8;
    lVar15 = lVar15 + 0x40;
  } while (lVar15 != 0);
  pIVar6 = IDenseNetworkBuilder::Build
                     ((IDenseNetworkBuilder *)local_158,
                      (vector<LayerMeta,_std::allocator<LayerMeta>_> *)(local_178 + 8),
                      (ISynapseBuilder *)local_78,(ILayerBuilder *)&local_180,
                      (IEventManager *)&local_68,generator,0.0);
  local_108 = (pointer)0x0;
  apfStack_100[0] = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppfStack_110 = (pointer *)0x0;
  local_128.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aStack_140._8_8_ = 0;
  pfStack_130 = (pointer)0x0;
  local_148 = (pointer)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_158 = (undefined1  [8])0x0;
  _Stack_150._M_p = (pointer)0x0;
  local_208.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_208.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_208.xTest.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_208.xTest.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.xTest.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_208.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_208.xTrain.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_208.xTrain.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.xTrain.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_280,path,(allocator *)&local_228);
  IRIS::ReadIris((string *)&local_280,(Dataset *)local_158,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  DATA_CONVERSION::ConvertDataToSpikeTrains
            ((Dataset *)local_158,&local_208,(linear_congruential_engine *)generator,200.0);
  local_240 = 0;
  local_210 = pIVar6;
  do {
    if (local_208.xTrain.
        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_208.xTrain.
        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_260 = 0.0;
      iVar16 = 0;
      local_28c = 0.0;
      iVar14 = 0;
      local_284 = 0;
      iVar4 = 0;
      local_288 = 0.0;
      _local_258 = ZEXT816(0);
    }
    else {
      _local_258 = ZEXT816(0);
      uVar11 = 0;
      fVar17 = 0.0;
      local_288 = 0.0;
      iVar4 = 0;
      local_284 = 0;
      iVar14 = 0;
      iVar12 = 0;
      iVar16 = 0;
      do {
        local_260 = (double)CONCAT44(local_260._4_4_,fVar17);
        IDenseNetwork::Forward
                  ((vector<float,_std::allocator<float>_> *)&local_280,pIVar6,
                   local_208.xTrain.
                   super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar11,200.0,false);
        local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        IDenseNetwork::GetOutputNeurons(&local_198,pIVar6);
        local_234 = NormedCustomLoss2(&local_198,
                                      local_208.yTrain.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start[uVar11],&local_228);
        if (local_198.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_198.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_198.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_198.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pIVar6 = local_210;
        fVar17 = *(float *)local_280._M_dataplus._M_p;
        uVar9 = (long)(local_280._M_string_length - (long)local_280._M_dataplus._M_p) >> 2;
        iVar3 = 0;
        if (1 < uVar9) {
          uVar13 = 1;
          uVar7 = 0;
          fVar18 = fVar17;
          do {
            fVar17 = *(float *)(local_280._M_dataplus._M_p + uVar13 * 4);
            if (fVar18 < fVar17) {
              uVar7 = uVar13;
            }
            iVar3 = (int)uVar7;
            if (fVar17 <= fVar18) {
              fVar17 = fVar18;
            }
            uVar13 = uVar13 + 1;
            fVar18 = fVar17;
          } while (uVar9 != uVar13);
        }
        if (fVar17 <= 0.0) {
          iVar3 = -1;
        }
        iVar14 = iVar14 + (uint)(iVar3 == 0);
        fVar17 = local_208.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
        local_98 = *(undefined8 *)
                    local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
        uStack_90 = 0;
        local_88 = ZEXT416((uint)local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start[2]);
        local_230 = iVar4;
        local_22c = iVar16;
        local_1a0 = uVar11;
        IDenseNetwork::Backward(local_210,&local_228);
        IDenseNetwork::GradStep(pIVar6,1,1e-06,1e-05,10.0,0.0001);
        IDenseNetwork::Reset(pIVar6);
        if (local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_280._M_dataplus._M_p,
                          local_280.field_2._M_allocated_capacity - (long)local_280._M_dataplus._M_p
                         );
        }
        local_288 = local_288 + local_234;
        iVar16 = local_22c + (uint)(iVar3 == -1);
        local_284 = local_284 + (uint)(iVar3 == 1);
        iVar4 = local_230 + (uint)(iVar3 == 2);
        iVar12 = iVar12 + (uint)(ABS((float)iVar3 - fVar17) < 0.1);
        local_258._0_4_ = (float)local_258._0_4_ + ABS((float)local_98);
        local_258._4_4_ = (float)local_258._4_4_ + ABS(local_98._4_4_);
        uStack_250._0_4_ = (float)uStack_250 + ABS((float)uStack_90);
        uStack_250._4_4_ = uStack_250._4_4_ + ABS(uStack_90._4_4_);
        fVar17 = local_260._0_4_ + ABS((float)local_88._0_4_);
        uVar11 = local_1a0 + 1;
        uVar9 = ((long)local_208.xTrain.
                       super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_208.xTrain.
                       super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        pIVar6 = local_210;
      } while (uVar11 <= uVar9 && uVar9 - uVar11 != 0);
      dVar2 = (double)(float)local_258._4_4_;
      uStack_250._0_4_ = (float)SUB84(dVar2,0);
      local_258 = (undefined1  [8])(double)(float)local_258._0_4_;
      uStack_250._4_4_ = (float)(int)((ulong)dVar2 >> 0x20);
      local_260 = (double)fVar17;
      local_28c = (float)iVar12;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Loss for epoch: ",0x10);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 3;
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_240);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," is: ",5);
    lVar15 = std::cout;
    *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                  *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(&PreciseEventManager::vtable + *(long *)(lVar15 + -0x18)) = 5;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar15 + -0x18)) = 9;
    poVar8 = std::ostream::_M_insert<double>
                       ((double)(local_288 /
                                (float)(ulong)(((long)local_208.xTrain.
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)local_208.xTrain.
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                              -0x5555555555555555)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Predictions: cetoza-",0x14);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," versi-",7);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_284);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," virginica-",0xb);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"deltas: cetoza-",0xf);
    poVar8 = std::ostream::_M_insert<double>((double)local_258);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," versi-",7);
    poVar8 = std::ostream::_M_insert<double>(uStack_250);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," virginica-",0xb);
    poVar8 = std::ostream::_M_insert<double>(local_260);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Accuracy: ",10);
    poVar8 = std::ostream::_M_insert<double>
                       ((double)(local_28c /
                                (float)(ulong)(((long)local_208.xTrain.
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)local_208.xTrain.
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                              -0x5555555555555555)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Silent samples: ",0x10);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 3;
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," | ",3);
    IDenseNetwork::GetStringStats_abi_cxx11_(&local_280,pIVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_280._M_dataplus._M_p,local_280._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    IDenseNetwork::ResetStats(pIVar6);
    uVar5 = (int)local_240 + 1;
    local_240 = (ulong)uVar5;
  } while (uVar5 != 100);
  ppIVar1 = (pIVar6->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar1 != (pointer)0x0) {
    operator_delete(ppIVar1,(long)(pIVar6->layers).
                                  super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppIVar1);
  }
  operator_delete(pIVar6,0x30);
  if (local_208.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::~vector(&local_208.xTest);
  if (local_208.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::~vector(&local_208.xTrain);
  if (ppfStack_110 != (pointer *)0x0) {
    operator_delete(ppfStack_110,(long)apfStack_100[0] - (long)ppfStack_110);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_128);
  if ((void *)aStack_140._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)aStack_140._M_allocated_capacity,(long)pfStack_130 - aStack_140._0_8_);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)local_158);
  std::vector<LayerMeta,_std::allocator<LayerMeta>_>::~vector
            ((vector<LayerMeta,_std::allocator<LayerMeta>_> *)(local_178 + 8));
  local_68 = std::__detail::_Prime_rehash_policy::_M_need_rehash;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>_>_>
  ::~_Rb_tree(local_60);
  return;
}

Assistant:

void DemoScripts::TrainSpikingIris( char *path, std::default_random_engine &generator )
{
    float EPS = 1e-1;
    float LEARNING_RATE_V = 0.000001;
    float LEARNING_RATE_W = 0.00001;
    float SIMULATION_TIME = 200;

    size_t IRIS_INPUT = 4;
    size_t IRIS_OUTPUT = 3;

    int BATCH_SIZE = 1;

    const float ALPHA = 0.05;
    const float BETA = 10;
    const float LAMBDA = 0.0001;


    std::vector<ILayer *> layers;
    LifSynapseBuilder synapseBuilder = LifSynapseBuilder( generator );
    LifNeuronBuilder neuronBuilder = LifNeuronBuilder();
    DenseLifLayerBuilder layerBuilder = DenseLifLayerBuilder();
    PreciseEventManager eventManager = PreciseEventManager();


    std::vector<LayerMeta> layersMeta = {
            {1,   "input",   IRIS_INPUT,  neuronBuilder, 1,   0},
            {1,   "hidden2", 6,           neuronBuilder, 2,   1},
            {0.5, "output",  IRIS_OUTPUT, neuronBuilder, 0.5, 1}
    };

    auto network = IDenseNetworkBuilder().Build( layersMeta, synapseBuilder, layerBuilder, eventManager,
                                                 generator, 0 );

    SPIKING_NN::Dataset rawData;
    SPIKING_NN::SpikeTrainDataset data;
    IRIS::ReadIris( path, rawData, 0 );
    DATA_CONVERSION::ConvertDataToSpikeTrains( rawData, data, generator, SIMULATION_TIME );

    for ( int epochId = 0; epochId < 100; epochId++ ) {
        float totalLoss = 0.f;
        int silentSamples = 0;
        int guesses = 0;
        int cetozaCnt = 0;
        int versiCnt = 0;
        int virginicaCnt = 0;
        float cetozaDelta = 0;
        float versiDelta = 0;
        float viriginicaDelta = 0;

        for ( int sampleId = 0; sampleId < data.xTrain.size(); sampleId++ ) {
            std::vector<float> output = network->Forward( data.xTrain[sampleId], SIMULATION_TIME, false );

            std::vector<float> deltas;
            float loss = NormedCustomLoss2( network->GetOutputNeurons(), data.yTrain[sampleId], deltas );
            totalLoss += loss;
            int predictedClassId = GetClassPrediction( output );
            silentSamples += predictedClassId == -1 ? 1 : 0;
            cetozaCnt += predictedClassId == 0 ? 1 : 0;
            versiCnt += predictedClassId == 1 ? 1 : 0;
            virginicaCnt += predictedClassId == 2 ? 1 : 0;
            int guess = abs((float) predictedClassId - data.yTrain[sampleId] ) < EPS;
            guesses += guess;
            cetozaDelta += abs( deltas[0] );
            versiDelta += abs( deltas[1] );
            viriginicaDelta += abs( deltas[2] );

            network->Backward( deltas );

            if (( sampleId + 1 ) % BATCH_SIZE == 0 ) {
                network->GradStep( BATCH_SIZE, LEARNING_RATE_V, LEARNING_RATE_W, BETA, LAMBDA );
            }
            network->Reset();
        }
        std::cout << "Loss for epoch: " << std::setw( 3 ) << epochId << " is: ";
        std::cout << std::fixed << std::setprecision( 5 ) << std::setw( 9 ) << totalLoss / data.xTrain.size() << " ";
        std::cout << "Predictions: cetoza-" << cetozaCnt << " versi-" << versiCnt << " virginica-" << virginicaCnt
                  << " ";
        std::cout << "deltas: cetoza-" << cetozaDelta << " versi-" << versiDelta << " virginica-" << viriginicaDelta
                  << " ";
        std::cout << "Accuracy: " << (float) guesses / data.xTrain.size() << " ";
        std::cout << "Silent samples: " << std::setw( 3 ) << silentSamples << " | ";
        std::cout << network->GetStringStats();
        network->ResetStats();
    }
    delete network;
}